

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O0

bool __thiscall QLCDNumber::checkOverflow(QLCDNumber *this,int num)

{
  long in_FS_OFFSET;
  int unaff_retaddr;
  int unaff_retaddr_00;
  QLCDNumberPrivate *d;
  bool of;
  undefined7 in_stack_fffffffffffffff0;
  byte bVar1;
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QLCDNumber *)0x5b9fb9);
  bVar1 = 0;
  int2string(unaff_retaddr_00,unaff_retaddr,(int)((ulong)lVar2 >> 0x20),
             (bool *)CONCAT17(0xaa,in_stack_fffffffffffffff0));
  QString::~QString((QString *)0x5b9ffa);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QLCDNumber::checkOverflow(int num) const
{
    Q_D(const QLCDNumber);
    bool of;
    int2string(num, d->base, d->ndigits, &of);
    return of;
}